

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int __thiscall smf::MidiEventList::append(MidiEventList *this,MidiEvent *event)

{
  MidiEvent *this_00;
  size_type sVar1;
  MidiEvent *local_20;
  MidiEvent *ptr;
  MidiEvent *event_local;
  MidiEventList *this_local;
  
  ptr = event;
  event_local = (MidiEvent *)this;
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00,ptr);
  local_20 = this_00;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back(&this->list,&local_20)
  ;
  sVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list);
  return (int)sVar1 + -1;
}

Assistant:

int MidiEventList::append(MidiEvent& event) {
	MidiEvent* ptr = new MidiEvent(event);
	list.push_back(ptr);
	return (int)list.size()-1;
}